

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::ShaderBuiltinVarTests::init(ShaderBuiltinVarTests *this,EVP_PKEY_CTX *ctx)

{
  char *__s;
  char *desc;
  Context *pCVar1;
  _func_int **pp_Var2;
  ShaderBuiltinConstantCase *pSVar3;
  int extraout_EAX;
  long *plVar4;
  ShaderDepthRangeTest *pSVar5;
  TestNode *pTVar6;
  long *plVar7;
  long lVar8;
  allocator<char> local_89;
  ShaderBuiltinConstantCase *local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  TestNode *local_40;
  GetConstantValueFunc local_38;
  
  lVar8 = 0x10;
  local_40 = (TestNode *)this;
  do {
    __s = *(char **)((long)&PTR_iterate_00cf7140 + lVar8);
    desc = *(char **)(&UNK_00cf7148 + lVar8);
    local_38 = *(GetConstantValueFunc *)((long)&init::builtinConstants[0].caseName + lVar8);
    local_88 = (ShaderBuiltinConstantCase *)operator_new(0xa8);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_60,__s,&local_89);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_60);
    pSVar3 = local_88;
    local_80 = &local_70;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_70 = *plVar7;
      lStack_68 = plVar4[3];
    }
    else {
      local_70 = *plVar7;
      local_80 = (long *)*plVar4;
    }
    local_78 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ShaderBuiltinConstantCase::ShaderBuiltinConstantCase
              (local_88,pCVar1,(char *)local_80,desc,desc,local_38,SHADERTYPE_VERTEX);
    tcu::TestNode::addChild(local_40,(TestNode *)pSVar3);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    this = (ShaderBuiltinVarTests *)local_40;
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
    local_88 = (ShaderBuiltinConstantCase *)operator_new(0xa8);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_60,__s,&local_89);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_60);
    pSVar3 = local_88;
    local_80 = &local_70;
    plVar7 = plVar4 + 2;
    if ((long *)*plVar4 == plVar7) {
      local_70 = *plVar7;
      lStack_68 = plVar4[3];
    }
    else {
      local_70 = *plVar7;
      local_80 = (long *)*plVar4;
    }
    local_78 = plVar4[1];
    *plVar4 = (long)plVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    ShaderBuiltinConstantCase::ShaderBuiltinConstantCase
              (local_88,pCVar1,(char *)local_80,desc,desc,local_38,SHADERTYPE_FRAGMENT);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar3);
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x118);
  pSVar5 = (ShaderDepthRangeTest *)operator_new(0x150);
  ShaderDepthRangeTest::ShaderDepthRangeTest
            (pSVar5,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
             "depth_range_vertex","gl_DepthRange",true);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar5);
  pSVar5 = (ShaderDepthRangeTest *)operator_new(0x150);
  ShaderDepthRangeTest::ShaderDepthRangeTest
            (pSVar5,(Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode,
             "depth_range_fragment","gl_DepthRange",false);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar5);
  pTVar6 = (TestNode *)operator_new(200);
  pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase((TestCase *)pTVar6,(TestContext *)*pp_Var2,"vertex_id","gl_VertexID Test")
  ;
  pTVar6[1]._vptr_TestNode = pp_Var2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__VertexIDCase_00cf70e8;
  pTVar6[1].m_testCtx = (TestContext *)0x0;
  pTVar6[1].m_name._M_dataplus._M_p = (pointer)0x0;
  pTVar6[1].m_name._M_string_length = 0;
  pTVar6[1].m_name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar6[1].m_name.field_2 + 8) = 0;
  pTVar6[1].m_description._M_dataplus._M_p = (pointer)0x0;
  pTVar6[1].m_description._M_string_length = 0;
  pTVar6[1].m_description.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pTVar6[1].m_description.field_2 + 4) = 0;
  *(undefined8 *)((long)&pTVar6[1].m_description.field_2 + 0xc) = 0;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,(TestContext *)*pp_Var2,"fragcoord_xyz","gl_FragCoord.xyz Test");
  pTVar6[1]._vptr_TestNode = pp_Var2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf7418;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,(TestContext *)*pp_Var2,"fragcoord_w","gl_FragCoord.w Test");
  pTVar6[1]._vptr_TestNode = pp_Var2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf7468;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,(TestContext *)*pp_Var2,"pointcoord","gl_PointCoord Test");
  pTVar6[1]._vptr_TestNode = pp_Var2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf74b8;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  pTVar6 = (TestNode *)operator_new(0x78);
  pp_Var2 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCase::TestCase
            ((TestCase *)pTVar6,(TestContext *)*pp_Var2,"frontfacing","gl_FrontFacing Test");
  pTVar6[1]._vptr_TestNode = pp_Var2;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00cf7508;
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  return extraout_EAX;
}

Assistant:

void ShaderBuiltinVarTests::init (void)
{
	// Builtin constants.

	static const struct
	{
		const char*											caseName;
		const char*											varName;
		ShaderBuiltinConstantCase::GetConstantValueFunc		getValue;
	} builtinConstants[] =
	{
		// GLES 2.

		{ "max_vertex_attribs",					"gl_MaxVertexAttribs",				getInteger<GL_MAX_VERTEX_ATTRIBS>						},
		{ "max_vertex_uniform_vectors",			"gl_MaxVertexUniformVectors",		getInteger<GL_MAX_VERTEX_UNIFORM_VECTORS>				},
		{ "max_fragment_uniform_vectors",		"gl_MaxFragmentUniformVectors",		getInteger<GL_MAX_FRAGMENT_UNIFORM_VECTORS>				},
		{ "max_texture_image_units",			"gl_MaxTextureImageUnits",			getInteger<GL_MAX_TEXTURE_IMAGE_UNITS>					},
		{ "max_vertex_texture_image_units",		"gl_MaxVertexTextureImageUnits",	getInteger<GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS>			},
		{ "max_combined_texture_image_units",	"gl_MaxCombinedTextureImageUnits",	getInteger<GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS>			},
		{ "max_draw_buffers",					"gl_MaxDrawBuffers",				getInteger<GL_MAX_DRAW_BUFFERS>							},

		// GLES 3.

		{ "max_vertex_output_vectors",			"gl_MaxVertexOutputVectors",		getVectorsFromComps<GL_MAX_VERTEX_OUTPUT_COMPONENTS>	},
		{ "max_fragment_input_vectors",			"gl_MaxFragmentInputVectors",		getVectorsFromComps<GL_MAX_FRAGMENT_INPUT_COMPONENTS>	},
		{ "min_program_texel_offset",			"gl_MinProgramTexelOffset",			getInteger<GL_MIN_PROGRAM_TEXEL_OFFSET>					},
		{ "max_program_texel_offset",			"gl_MaxProgramTexelOffset",			getInteger<GL_MAX_PROGRAM_TEXEL_OFFSET>					}
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(builtinConstants); ndx++)
	{
		const char* const										caseName	= builtinConstants[ndx].caseName;
		const char* const										varName		= builtinConstants[ndx].varName;
		const ShaderBuiltinConstantCase::GetConstantValueFunc	getValue	= builtinConstants[ndx].getValue;

		addChild(new ShaderBuiltinConstantCase(m_context, (string(caseName) + "_vertex").c_str(),	varName, varName, getValue, glu::SHADERTYPE_VERTEX));
		addChild(new ShaderBuiltinConstantCase(m_context, (string(caseName) + "_fragment").c_str(),	varName, varName, getValue, glu::SHADERTYPE_FRAGMENT));
	}

	addChild(new ShaderDepthRangeTest(m_context, "depth_range_vertex",		"gl_DepthRange", true));
	addChild(new ShaderDepthRangeTest(m_context, "depth_range_fragment",	"gl_DepthRange", false));

	// Vertex shader builtin variables.
	addChild(new VertexIDCase		(m_context));
	// \todo [2013-03-20 pyry] gl_InstanceID -- tested in instancing tests quite thoroughly.

	// Fragment shader builtin variables.

	addChild(new FragCoordXYZCase	(m_context));
	addChild(new FragCoordWCase		(m_context));
	addChild(new PointCoordCase		(m_context));
	addChild(new FrontFacingCase	(m_context));
}